

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::BlockStatementSyntax::setChild
          (BlockStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0045290c + *(int *)(&DAT_0045290c + index * 4)))();
  return;
}

Assistant:

void BlockStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: begin = child.token(); return;
        case 3: blockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        case 4: items = child.node()->as<SyntaxList<SyntaxNode>>(); return;
        case 5: end = child.token(); return;
        case 6: endBlockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}